

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

void Llb_Nonlin4RecomputeScores(Llb_Mgr_t_conflict *p)

{
  int iVar1;
  Llb_Prt_t *pLVar2;
  Llb_Var_t *pLVar3;
  int local_28;
  int local_24;
  int k;
  int i;
  Llb_Var_t *pVar;
  Llb_Prt_t *pPart;
  Llb_Mgr_t_conflict *p_local;
  
  for (local_24 = 0; local_24 < p->iPartFree; local_24 = local_24 + 1) {
    pLVar2 = Llb_MgrPart(p,local_24);
    if (pLVar2 != (Llb_Prt_t *)0x0) {
      iVar1 = Cudd_DagSize(pLVar2->bFunc);
      pLVar2->nSize = iVar1;
    }
  }
  for (local_24 = 0; local_24 < p->nVars; local_24 = local_24 + 1) {
    pLVar3 = Llb_MgrVar(p,local_24);
    if (pLVar3 != (Llb_Var_t *)0x0) {
      pLVar3->nScore = 0;
      for (local_28 = 0; iVar1 = Vec_IntSize(pLVar3->vParts), local_28 < iVar1;
          local_28 = local_28 + 1) {
        iVar1 = Vec_IntEntry(pLVar3->vParts,local_28);
        pLVar2 = Llb_MgrPart(p,iVar1);
        pLVar3->nScore = pLVar2->nSize + pLVar3->nScore;
      }
    }
  }
  return;
}

Assistant:

void Llb_Nonlin4RecomputeScores( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k;
    Llb_MgrForEachPart( p, pPart, i )
        pPart->nSize = Cudd_DagSize(pPart->bFunc);
    Llb_MgrForEachVar( p, pVar, i )
    {
        pVar->nScore = 0;
        Llb_VarForEachPart( p, pVar, pPart, k )
            pVar->nScore += pPart->nSize;
    }
}